

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O3

void __thiscall chrono::ChDirectSolverLS::ArchiveOUT(ChDirectSolverLS *this,ChArchiveOut *marchive)

{
  char *local_38;
  bool *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChDirectSolverLS>(marchive);
  ChSolver::ArchiveOUT((ChSolver *)this,marchive);
  local_30 = &this->m_lock;
  local_38 = "m_lock";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = &this->m_use_learner;
  local_38 = "m_use_learner";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = &this->m_use_perm;
  local_38 = "m_use_perm";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = &this->m_use_rhs_sparsity;
  local_38 = "m_use_rhs_sparsity";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChDirectSolverLS::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChDirectSolverLS>();

    // serialize parent class
    ChSolver::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_lock);
    marchive << CHNVP(m_use_learner);
    marchive << CHNVP(m_use_perm);
    marchive << CHNVP(m_use_rhs_sparsity);
}